

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManSeqEquivDivide(Gia_Man_t *p,Cec_ParCor_t *pPars)

{
  int v;
  Gia_Man_t *pAig;
  Gia_Obj_t *pGVar1;
  uint v_00;
  int n;
  long lVar2;
  Gia_Man_t *pParts [2];
  Gia_Man_t *local_38 [2];
  
  lVar2 = 0;
  do {
    if (lVar2 == 2) {
      Gia_ManSeqEquivMerge(p,local_38);
      Gia_ManStop(local_38[0]);
      Gia_ManStop(local_38[1]);
      return;
    }
    pAig = Gia_ManDupHalfSeq(p,(int)lVar2);
    local_38[lVar2] = pAig;
    Cec_ManLSCorrespondenceClasses(pAig,pPars);
    for (v_00 = 0; (int)v_00 < p->nObjs; v_00 = v_00 + 1) {
      pGVar1 = Gia_ManObj(p,v_00);
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      if (pGVar1->Value != 0xffffffff) {
        v = Abc_Lit2Var(pGVar1->Value);
        pGVar1 = Gia_ManObj(pAig,v);
        pGVar1->Value = v_00;
      }
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void Gia_ManSeqEquivDivide( Gia_Man_t * p, Cec_ParCor_t * pPars )
{
    Gia_Man_t * pParts[2];
    Gia_Obj_t * pObj;
    int n, i;
    for ( n = 0; n < 2; n++ )
    {
        // derive n-th part of the AIG
        pParts[n] = Gia_ManDupHalfSeq( p, n );
        //Gia_ManPrintStats( pParts[n], NULL );
        // compute equivalences (recorded internally using pReprs and pNexts)
        Cec_ManLSCorrespondenceClasses( pParts[n], pPars );
        // make the nodes of the part AIG point to their prototypes in the AIG
        Gia_ManForEachObj( p, pObj, i )
            if ( ~pObj->Value )
                Gia_ManObj( pParts[n], Abc_Lit2Var(pObj->Value) )->Value = i;
    }
    Gia_ManSeqEquivMerge( p, pParts );
    Gia_ManStop( pParts[0] );
    Gia_ManStop( pParts[1] );
}